

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O0

FunctionPtrList * __thiscall
Jinx::Impl::Library::Functions(FunctionPtrList *__return_storage_ptr__,Library *this)

{
  bool bVar1;
  size_type __n;
  reference local_60;
  reference local_58;
  FunctionSignature *fn;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
  *__range2;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  Library *this_local;
  FunctionPtrList *fnList;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_functionMutex);
  std::
  vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
  ::vector(__return_storage_ptr__);
  __n = std::
        vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
        ::size(&this->m_functionList);
  std::
  vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
  ::reserve(__return_storage_ptr__,__n);
  __end2 = std::
           vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
           ::begin(&this->m_functionList);
  fn = (FunctionSignature *)
       std::
       vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
       ::end(&this->m_functionList);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
                                     *)&fn), bVar1) {
    local_60 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
               ::operator*(&__end2);
    local_58 = local_60;
    std::
    vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
    ::push_back(__return_storage_ptr__,&local_60);
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
    ::operator++(&__end2);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

inline_t const FunctionPtrList Library::Functions() const
	{
		std::lock_guard<std::mutex> lock(m_functionMutex);
		FunctionPtrList fnList;
		fnList.reserve(m_functionList.size());
		for (const auto & fn : m_functionList)
			fnList.push_back(&fn);
		return fnList;
	}